

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Template.hpp
# Opt level: O0

void __thiscall
Qentem::TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::renderLoop
          (TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *this,LoopTag *tag,
          SizeT *offset)

{
  byte bVar1;
  bool bVar2;
  SizeT SVar3;
  TagBit *pTVar4;
  LoopItem *pLVar5;
  Value<char> *pVVar6;
  LoopItem *item_1;
  LoopItem *item;
  StringView<char> SStack_78;
  uint local_64;
  SizeT local_60;
  SizeT loop_index;
  SizeT loop_size;
  SizeT content_offset;
  TagBit *s_end;
  TagBit *s_tag;
  Value<char> *local_40;
  Value<char> *loop_set;
  Value<char> grouped_set;
  SizeT *offset_local;
  LoopTag *tag_local;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *this_local;
  
  grouped_set._16_8_ = offset;
  Value<char>::Value((Value<char> *)&loop_set);
  StringStream<char>::Write
            (this->stream_,this->content_ + *(uint *)grouped_set._16_8_,
             tag->Offset - *(int *)grouped_set._16_8_);
  *(SizeT *)grouped_set._16_8_ = tag->EndOffset;
  *(int *)grouped_set._16_8_ = *(int *)grouped_set._16_8_ + 7;
  if ((tag->Set).Length == 0) {
    local_40 = this->value_;
  }
  else {
    local_40 = getValue(this,&tag->Set);
  }
  if (local_40 != (Value<char> *)0x0) {
    if (tag->GroupLength != '\0') {
      bVar2 = Value<char>::GroupBy
                        (local_40,(Value<char> *)&loop_set,
                         this->content_ + (long)(int)(uint)tag->GroupOffset + (ulong)tag->Offset,
                         (uint)tag->GroupLength);
      if (!bVar2) {
        s_tag._4_4_ = 1;
        goto LAB_0011ce3f;
      }
      local_40 = (Value<char> *)&loop_set;
    }
    if (1 < tag->Options) {
      if (tag->GroupLength == '\0') {
        Value<char>::operator=((Value<char> *)&loop_set,local_40);
        local_40 = (Value<char> *)&loop_set;
      }
      Value<char>::Sort((Value<char> *)&loop_set,(tag->Options & 2) == 2);
    }
    pTVar4 = Array<Qentem::Tags::TagBit>::First(&tag->SubTags);
    s_end = pTVar4;
    SVar3 = Array<Qentem::Tags::TagBit>::Size(&tag->SubTags);
    _loop_size = pTVar4 + SVar3;
    loop_index = tag->Offset + (uint)tag->ContentOffset;
    local_60 = Value<char>::Size(local_40);
    local_64 = 0;
    SVar3 = Array<Qentem::TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::LoopItem>
            ::Size(this->loops_items_);
    if (SVar3 <= tag->Level) {
      item = (LoopItem *)0x0;
      memset(&SStack_78,0,0x10);
      StringView<char>::StringView(&SStack_78);
      Array<Qentem::TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::LoopItem>
      ::operator+=(this->loops_items_,(LoopItem *)&item);
    }
    bVar2 = Value<char>::IsObject(local_40);
    if (bVar2) {
      for (; local_64 < local_60; local_64 = local_64 + 1) {
        pLVar5 = Array<Qentem::TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::LoopItem>
                 ::Storage(this->loops_items_);
        pLVar5 = pLVar5 + tag->Level;
        Value<char>::SetValueAndKey(local_40,local_64,&pLVar5->Value,&pLVar5->Key);
        if (pLVar5->Value != (Value<char> *)0x0) {
          render(this,s_end,_loop_size,loop_index,tag->EndOffset);
        }
      }
    }
    else {
      for (; local_64 < local_60; local_64 = local_64 + 1) {
        pLVar5 = Array<Qentem::TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::LoopItem>
                 ::Storage(this->loops_items_);
        bVar1 = tag->Level;
        pVVar6 = Value<char>::GetValue(local_40,local_64);
        pLVar5[bVar1].Value = pVVar6;
        if (pLVar5[bVar1].Value != (Value<char> *)0x0) {
          render(this,s_end,_loop_size,loop_index,tag->EndOffset);
        }
      }
    }
  }
  s_tag._4_4_ = 0;
LAB_0011ce3f:
  Value<char>::~Value((Value<char> *)&loop_set);
  return;
}

Assistant:

void renderLoop(const LoopTag &tag, SizeT &offset) const {
        Value_T        grouped_set;
        const Value_T *loop_set;

        stream_->Write((content_ + offset), (tag.Offset - offset));
        offset = tag.EndOffset;
        offset += TagPatterns::LoopSuffixLength;

        // Set (Array|Object)
        if (tag.Set.Length != 0) {
            loop_set = getValue(tag.Set);
        } else {
            loop_set = value_;
        }

        if (loop_set != nullptr) {
            // Group
            if (tag.GroupLength != 0) {
                if (!(loop_set->GroupBy(grouped_set, (content_ + tag.Offset + tag.GroupOffset), tag.GroupLength))) {
                    return;
                }

                loop_set = &grouped_set;
            }

            // Sort
            if (tag.Options > SizeT8{1}) {
                if (tag.GroupLength == 0) {
                    grouped_set = *loop_set;
                    loop_set    = &grouped_set;
                }

                grouped_set.Sort((tag.Options & LoopTagOptions::SortAscend) == LoopTagOptions::SortAscend);
            }

            // Stage 4: Render
            const TagBit *s_tag          = tag.SubTags.First();
            const TagBit *s_end          = (s_tag + tag.SubTags.Size());
            const SizeT   content_offset = (tag.Offset + tag.ContentOffset);
            const SizeT   loop_size      = loop_set->Size();
            SizeT         loop_index     = 0;

            if (loops_items_->Size() <= tag.Level) {
                *loops_items_ += LoopItem{};
            }

            if (loop_set->IsObject()) {
                while (loop_index < loop_size) {
                    LoopItem &item = loops_items_->Storage()[tag.Level];
                    loop_set->SetValueAndKey(loop_index, item.Value, item.Key);

                    if (item.Value != nullptr) {
                        render(s_tag, s_end, content_offset, tag.EndOffset);
                    }

                    ++loop_index;
                }
            } else {
                while (loop_index < loop_size) {
                    LoopItem &item = loops_items_->Storage()[tag.Level];
                    item.Value     = loop_set->GetValue(loop_index);

                    if (item.Value != nullptr) {
                        render(s_tag, s_end, content_offset, tag.EndOffset);
                    }

                    ++loop_index;
                }
            }
        }
    }